

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O2

CURLcode Curl_ntlm_core_mk_ntlmv2_hash
                   (char *user,size_t userlen,char *domain,size_t domlen,uchar *ntlmhash,
                   uchar *ntlmv2hash)

{
  uchar uVar1;
  CURLcode CVar2;
  uchar *data;
  size_t i;
  size_t sVar3;
  
  if (domlen < 0x7a1201 && userlen < 0x7a1201) {
    data = (uchar *)(*Curl_cmalloc)((domlen + userlen) * 2 + 1);
    if (data != (uchar *)0x0) {
      for (sVar3 = 0; userlen != sVar3; sVar3 = sVar3 + 1) {
        uVar1 = Curl_raw_toupper(user[sVar3]);
        data[sVar3 * 2] = uVar1;
        data[sVar3 * 2 + 1] = '\0';
      }
      ascii_to_unicode_le(data + userlen * 2,domain,domlen);
      CVar2 = Curl_hmacit(Curl_HMAC_MD5,ntlmhash,0x10,data,(domlen + userlen) * 2,ntlmv2hash);
      (*Curl_cfree)(data);
      return CVar2;
    }
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_ntlm_core_mk_ntlmv2_hash(const char *user, size_t userlen,
                                       const char *domain, size_t domlen,
                                       unsigned char *ntlmhash,
                                       unsigned char *ntlmv2hash)
{
  /* Unicode representation */
  size_t identity_len;
  unsigned char *identity;
  CURLcode result = CURLE_OK;

  if((userlen > CURL_MAX_INPUT_LENGTH) || (domlen > CURL_MAX_INPUT_LENGTH))
    return CURLE_OUT_OF_MEMORY;

  identity_len = (userlen + domlen) * 2;
  identity = malloc(identity_len + 1);

  if(!identity)
    return CURLE_OUT_OF_MEMORY;

  ascii_uppercase_to_unicode_le(identity, user, userlen);
  ascii_to_unicode_le(identity + (userlen << 1), domain, domlen);

  result = Curl_hmacit(Curl_HMAC_MD5, ntlmhash, 16, identity, identity_len,
                       ntlmv2hash);
  free(identity);

  return result;
}